

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O3

string * logfault::Handler::LevelName_abi_cxx11_(LogLevel level)

{
  int iVar1;
  undefined8 uVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
  *unaff_RBX;
  long unaff_R14;
  long *plVar3;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
  *paVar4;
  
  if (LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
    if (iVar1 != 0) {
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[0]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[0].field_2;
      unaff_RBX = &LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,"DISABLED",""
                );
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[1]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 1)
                 ,"ERROR","");
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[2]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 2)
                 ,"WARNING","");
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[3]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 3)
                 ,"NOTICE","");
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[4]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 4)
                 ,"INFO","");
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[5]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[5].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 5)
                 ,"DEBUGGING","");
      LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[6]._M_dataplus._M_p =
           (pointer)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems[6].field_2;
      unaff_R14 = 0x13f588;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 6)
                 ,"TRACE","");
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                   ::~array,&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
    }
  }
  if (level < (TRACE|ERROR)) {
    return LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + (int)level;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)level,7);
  plVar3 = (long *)(unaff_R14 + -0x10);
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    paVar4 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
              *)(plVar3 + -2);
    plVar3 = plVar3 + -4;
  } while (paVar4 != unaff_RBX);
  __cxa_guard_abort(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
  _Unwind_Resume(uVar2);
}

Assistant:

static const std::string& LevelName(const LogLevel level) {
            static const std::array<std::string, 7> names =
                {{"DISABLED", "ERROR", "WARNING", "NOTICE", "INFO", "DEBUGGING", "TRACE"}};
            return names.at(static_cast<size_t>(level));
        }